

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator_expression.hpp
# Opt level: O1

string * __thiscall
duckdb::OperatorExpression::ToString<duckdb::OperatorExpression,duckdb::ParsedExpression>
          (string *__return_storage_ptr__,OperatorExpression *this,OperatorExpression *entry)

{
  ExpressionType EVar1;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  int iVar5;
  const_reference pvVar6;
  pointer pPVar7;
  long *plVar8;
  undefined8 *puVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  InternalException *this_00;
  size_type *psVar11;
  ulong *puVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  ExpressionType type;
  ExpressionType type_00;
  char *pcVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  SQLIdentifier *in_R8;
  ulong __n;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *pvVar17;
  string op_type;
  string in_child;
  string child_list;
  string op;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string *local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  char local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  string local_50;
  
  ExpressionTypeToOperator_abi_cxx11_
            (&local_f0,(duckdb *)(ulong)(this->super_ParsedExpression).super_BaseExpression.type,
             (ExpressionType)entry);
  if (local_f0._M_string_length != 0) {
    pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::operator[](&this->children,0);
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar6);
    (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_238,pPVar7);
    plVar8 = (long *)::std::__cxx11::string::append((char *)&local_238);
    psVar11 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_218.field_2._M_allocated_capacity = *psVar11;
      local_218.field_2._8_8_ = plVar8[3];
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    }
    else {
      local_218.field_2._M_allocated_capacity = *psVar11;
      local_218._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_218._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_218,(ulong)local_f0._M_dataplus._M_p);
    puVar12 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_258.field_2._M_allocated_capacity = *puVar12;
      local_258.field_2._8_8_ = plVar8[3];
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    }
    else {
      local_258.field_2._M_allocated_capacity = *puVar12;
      local_258._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_258._M_string_length = plVar8[1];
    *plVar8 = (long)puVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_258);
    paVar10 = &local_278.field_2;
    puVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_278.field_2._M_allocated_capacity = *puVar12;
      local_278.field_2._8_8_ = puVar9[3];
      local_278._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_278.field_2._M_allocated_capacity = *puVar12;
      local_278._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_278._M_string_length = puVar9[1];
    *puVar9 = puVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::operator[](&this->children,1);
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar6);
    (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_1f8,pPVar7);
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar10) {
      uVar15 = local_278.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_1f8._M_string_length + local_278._M_string_length) {
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        uVar15 = local_1f8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_1f8._M_string_length + local_278._M_string_length)
      goto LAB_00e5e257;
      puVar9 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
    }
    else {
LAB_00e5e257:
      puVar9 = (undefined8 *)
               ::std::__cxx11::string::_M_append
                         ((char *)&local_278,(ulong)local_1f8._M_dataplus._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar11 = puVar9 + 2;
    if ((size_type *)*puVar9 == psVar11) {
      uVar15 = puVar9[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar15;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar9;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    }
    __return_storage_ptr__->_M_string_length = puVar9[1];
    *puVar9 = psVar11;
    puVar9[1] = 0;
    *(undefined1 *)psVar11 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar10) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    paVar10 = &local_238.field_2;
    goto LAB_00e5e389;
  }
  EVar1 = (this->super_ParsedExpression).super_BaseExpression.type;
  if (OPERATOR_NULLIF < EVar1) {
    switch(EVar1) {
    case OPERATOR_COALESCE:
switchD_00e5e289_caseD_98:
      ExpressionTypeToString_abi_cxx11_(__return_storage_ptr__,(duckdb *)(ulong)EVar1,type);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      puVar2 = (this->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,", ","");
      StringUtil::
      Join<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,unsigned_long,duckdb::OperatorExpression::ToString<duckdb::OperatorExpression,duckdb::ParsedExpression>(duckdb::OperatorExpression_const&)::_lambda(duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>const&)_2_>
                (&local_278,(StringUtil *)&this->children,(long)puVar3 - (long)puVar2 >> 3,
                 &local_258);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_278._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_00e5e397;
    case ARRAY_EXTRACT:
      pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::operator[](&this->children,0);
      pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar6);
      (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_218,pPVar7);
      puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_218);
      paVar10 = &local_258.field_2;
      puVar12 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_258.field_2._M_allocated_capacity = *puVar12;
        local_258.field_2._8_8_ = puVar9[3];
        local_258._M_dataplus._M_p = (pointer)paVar10;
      }
      else {
        local_258.field_2._M_allocated_capacity = *puVar12;
        local_258._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_258._M_string_length = puVar9[1];
      *puVar9 = puVar12;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::operator[](&this->children,1);
      pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar6);
      (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_238,pPVar7);
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar10) {
        uVar15 = local_258.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_238._M_string_length + local_258._M_string_length) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          uVar15 = local_238.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_238._M_string_length + local_258._M_string_length)
        goto LAB_00e5ed50;
        puVar9 = (undefined8 *)
                 ::std::__cxx11::string::replace
                           ((ulong)&local_238,0,(char *)0x0,(ulong)local_258._M_dataplus._M_p);
      }
      else {
LAB_00e5ed50:
        puVar9 = (undefined8 *)
                 ::std::__cxx11::string::_M_append
                           ((char *)&local_258,(ulong)local_238._M_dataplus._M_p);
      }
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      puVar12 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_278.field_2._M_allocated_capacity = *puVar12;
        local_278.field_2._8_8_ = puVar9[3];
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar12;
        local_278._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_278._M_string_length = puVar9[1];
      *puVar9 = puVar12;
      puVar9[1] = 0;
      *(undefined1 *)puVar12 = 0;
      plVar8 = (long *)::std::__cxx11::string::append((char *)&local_278);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar11) {
        lVar4 = plVar8[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      }
      __return_storage_ptr__->_M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar10) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      paVar10 = &local_218.field_2;
      goto LAB_00e5e389;
    case ARRAY_SLICE:
      pvVar17 = &this->children;
      pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::operator[](pvVar17,1);
      pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar6);
      (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_278,pPVar7);
      iVar5 = ::std::__cxx11::string::compare((char *)&local_278);
      if (iVar5 == 0) {
        ::std::__cxx11::string::operator=((string *)&local_278,anon_var_dwarf_4f001a4 + 9);
      }
      pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::operator[](pvVar17,2);
      pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar6);
      (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_258,pPVar7);
      iVar5 = ::std::__cxx11::string::compare((char *)&local_258);
      if (iVar5 == 0) {
        pcVar14 = anon_var_dwarf_4f001a4 + 9;
        if ((long)(this->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x20) {
          pcVar14 = "-";
        }
        ::std::__cxx11::string::operator=((string *)&local_258,pcVar14);
      }
      if ((long)(this->children).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->children).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x20) {
        pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 ::operator[](pvVar17,0);
        pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(pvVar6);
        (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(local_90,pPVar7);
        plVar8 = (long *)::std::__cxx11::string::append(local_90);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_190.field_2._M_allocated_capacity = *psVar11;
          local_190.field_2._8_8_ = plVar8[3];
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        }
        else {
          local_190.field_2._M_allocated_capacity = *psVar11;
          local_190._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_190._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        ::std::operator+(&local_1b0,&local_190,&local_278);
        puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1b0);
        psVar11 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_1d0.field_2._M_allocated_capacity = *psVar11;
          local_1d0.field_2._8_8_ = puVar9[3];
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        }
        else {
          local_1d0.field_2._M_allocated_capacity = *psVar11;
          local_1d0._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_1d0._M_string_length = puVar9[1];
        *puVar9 = psVar11;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        ::std::operator+(&local_1f8,&local_1d0,&local_258);
        puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1f8);
        puVar12 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_238.field_2._M_allocated_capacity = *puVar12;
          local_238.field_2._8_8_ = puVar9[3];
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        }
        else {
          local_238.field_2._M_allocated_capacity = *puVar12;
          local_238._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_238._M_string_length = puVar9[1];
        *puVar9 = puVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 ::operator[](pvVar17,3);
        pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(pvVar6);
        (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_b0,pPVar7);
        ::std::operator+(&local_218,&local_238,&local_b0);
        ::std::operator+(__return_storage_ptr__,&local_218,"]");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p);
        }
        paVar10 = &local_80;
      }
      else {
        pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 ::operator[](pvVar17,0);
        pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(pvVar6);
        (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_1b0,pPVar7);
        plVar8 = (long *)::std::__cxx11::string::append((char *)&local_1b0);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_1d0.field_2._M_allocated_capacity = *psVar11;
          local_1d0.field_2._8_8_ = plVar8[3];
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        }
        else {
          local_1d0.field_2._M_allocated_capacity = *psVar11;
          local_1d0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_1d0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        ::std::operator+(&local_1f8,&local_1d0,&local_278);
        puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1f8);
        puVar12 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_238.field_2._M_allocated_capacity = *puVar12;
          local_238.field_2._8_8_ = puVar9[3];
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        }
        else {
          local_238.field_2._M_allocated_capacity = *puVar12;
          local_238._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_238._M_string_length = puVar9[1];
        *puVar9 = puVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        ::std::operator+(&local_218,&local_238,&local_258);
        ::std::operator+(__return_storage_ptr__,&local_218,"]");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        paVar10 = &local_1b0.field_2;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined1 **)(paVar10->_M_local_buf + -0x10) != paVar10) {
        operator_delete(*(undefined1 **)(paVar10->_M_local_buf + -0x10));
      }
      _Var16._M_p = local_258._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
LAB_00e5f224:
        operator_delete(_Var16._M_p);
      }
      break;
    case STRUCT_EXTRACT:
      pvVar17 = &this->children;
      pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::operator[](pvVar17,1);
      pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar6);
      if ((pPVar7->super_BaseExpression).type != VALUE_CONSTANT) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        goto LAB_00e5e397;
      }
      pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::operator[](pvVar17,1);
      pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar6);
      (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_278,pPVar7);
      local_150[0] = &local_140;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"(%s).%s","");
      pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::operator[](pvVar17,0);
      pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar6);
      (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_d0,pPVar7);
      ::std::__cxx11::string::substr((ulong)&local_258,(ulong)&local_278);
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,local_258._M_dataplus._M_p,
                 local_258._M_dataplus._M_p + local_258._M_string_length);
      StringUtil::Format<std::__cxx11::string,duckdb::SQLIdentifier>
                (__return_storage_ptr__,(StringUtil *)local_150,&local_d0,&local_170,in_R8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      _Var16._M_p = (pointer)local_150[0];
      if (local_150[0] != &local_140) goto LAB_00e5f224;
      break;
    case ARRAY_CONSTRUCTOR:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"(ARRAY[","");
      puVar2 = (this->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,", ","");
      StringUtil::
      Join<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,unsigned_long,duckdb::OperatorExpression::ToString<duckdb::OperatorExpression,duckdb::ParsedExpression>(duckdb::OperatorExpression_const&)::_lambda(duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>const&)_3_>
                (&local_278,(StringUtil *)&this->children,(long)puVar3 - (long)puVar2 >> 3,
                 &local_258);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_278._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_00e5e397;
    default:
switchD_00e5e289_caseD_9d:
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,"Unrecognized operator type","");
      InternalException::InternalException(this_00,(string *)&local_278);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case OPERATOR_TRY:
      paVar10 = &local_120;
      local_130[0] = paVar10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"TRY(%s)","");
      pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::operator[](&this->children,0);
      pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar6);
      pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (pPVar7->super_BaseExpression)._vptr_BaseExpression;
      (*(code *)pbVar13[2]._M_dataplus._M_p)(&local_70,pPVar7);
      StringUtil::Format<std::__cxx11::string>
                (__return_storage_ptr__,(StringUtil *)local_130,&local_70,pbVar13);
      _Var16._M_p = (pointer)local_130[0];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
        _Var16._M_p = (pointer)local_130[0];
      }
      goto LAB_00e5ec35;
    }
    paVar10 = &local_278.field_2;
    goto LAB_00e5e389;
  }
  switch(EVar1) {
  case OPERATOR_NOT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(","");
    local_1d8 = (string *)&__return_storage_ptr__->field_2;
    ExpressionTypeToString_abi_cxx11_
              (&local_278,(duckdb *)(ulong)(this->super_ParsedExpression).super_BaseExpression.type,
               type_00);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_278._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    puVar2 = (this->children).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->children).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,", ","");
    StringUtil::
    Join<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,unsigned_long,duckdb::OperatorExpression::ToString<duckdb::OperatorExpression,duckdb::ParsedExpression>(duckdb::OperatorExpression_const&)::_lambda(duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>const&)_1_>
              (&local_278,(StringUtil *)&this->children,(long)puVar3 - (long)puVar2 >> 3,&local_258)
    ;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_278._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    goto LAB_00e5e397;
  case OPERATOR_IS_NULL:
    pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::operator[](&this->children,0);
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar6);
    (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_258);
    puVar9 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,0x1e3d62c);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    puVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_278.field_2._M_allocated_capacity = *puVar12;
      local_278.field_2._8_8_ = puVar9[3];
    }
    else {
      local_278.field_2._M_allocated_capacity = *puVar12;
      local_278._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_278._M_string_length = puVar9[1];
    *puVar9 = puVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    plVar8 = (long *)::std::__cxx11::string::append((char *)&local_278);
    break;
  case OPERATOR_IS_NOT_NULL:
    pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::operator[](&this->children,0);
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar6);
    (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_258);
    puVar9 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,0x1e3d62c);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    puVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_278.field_2._M_allocated_capacity = *puVar12;
      local_278.field_2._8_8_ = puVar9[3];
    }
    else {
      local_278.field_2._M_allocated_capacity = *puVar12;
      local_278._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_278._M_string_length = puVar9[1];
    *puVar9 = puVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    plVar8 = (long *)::std::__cxx11::string::append((char *)&local_278);
    break;
  case OPERATOR_UNPACK:
    paVar10 = &local_100;
    local_110[0] = paVar10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"UNPACK(%s)","");
    pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::operator[](&this->children,0);
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar6);
    pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (pPVar7->super_BaseExpression)._vptr_BaseExpression;
    (*(code *)pbVar13[2]._M_dataplus._M_p)(&local_50,pPVar7);
    StringUtil::Format<std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)local_110,&local_50,pbVar13);
    _Var16._M_p = (pointer)local_110[0];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
      _Var16._M_p = (pointer)local_110[0];
    }
    goto LAB_00e5ec35;
  default:
    if (1 < EVar1 - 0x23) {
      if (EVar1 != GROUPING_FUNCTION) goto switchD_00e5e289_caseD_9d;
      goto switchD_00e5e289_caseD_98;
    }
    pcVar14 = " NOT IN ";
    if (EVar1 == COMPARE_IN) {
      pcVar14 = " IN ";
    }
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,pcVar14,pcVar14 + (ulong)(EVar1 != COMPARE_IN) * 4 + 4);
    pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::operator[](&this->children,0);
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar6);
    (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_258,pPVar7);
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    local_1d8 = __return_storage_ptr__;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"(","");
    if (8 < (ulong)((long)(this->children).
                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->children).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
      __n = 1;
      do {
        if (1 < __n) {
          ::std::__cxx11::string::append((char *)&local_218);
        }
        pvVar6 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 ::operator[](&this->children,__n);
        pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(pvVar6);
        (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[8])(&local_238,pPVar7);
        ::std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_238._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)(this->children).
                                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->children).
                                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    ::std::__cxx11::string::append((char *)&local_218);
    ::std::operator+(&local_1d0,"(",&local_258);
    plVar8 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_1d0,(ulong)local_278._M_dataplus._M_p);
    __return_storage_ptr__ = local_1d8;
    puVar12 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_1f8.field_2._M_allocated_capacity = *puVar12;
      local_1f8.field_2._8_8_ = plVar8[3];
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *puVar12;
      local_1f8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_1f8._M_string_length = plVar8[1];
    *plVar8 = (long)puVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_1f8,(ulong)local_218._M_dataplus._M_p);
    puVar12 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_238.field_2._M_allocated_capacity = *puVar12;
      local_238.field_2._8_8_ = plVar8[3];
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = *puVar12;
      local_238._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_238._M_string_length = plVar8[1];
    *plVar8 = (long)puVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)::std::__cxx11::string::append((char *)&local_238);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar11) {
      lVar4 = plVar8[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    }
    __return_storage_ptr__->_M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    paVar10 = &local_278.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    _Var16._M_p = local_278._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
      _Var16._M_p = local_278._M_dataplus._M_p;
    }
LAB_00e5ec35:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var16._M_p == paVar10) goto LAB_00e5e397;
    goto LAB_00e5e392;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar11) {
    lVar4 = plVar8[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
  }
  __return_storage_ptr__->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  paVar10 = &local_258.field_2;
LAB_00e5e389:
  _Var16._M_p = (pointer)(&paVar10->_M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var16._M_p != paVar10) {
LAB_00e5e392:
    operator_delete(_Var16._M_p);
  }
LAB_00e5e397:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static string ToString(const T &entry) {
		auto op = ExpressionTypeToOperator(entry.GetExpressionType());
		if (!op.empty()) {
			// use the operator string to represent the operator
			D_ASSERT(entry.children.size() == 2);
			return entry.children[0]->ToString() + " " + op + " " + entry.children[1]->ToString();
		}
		switch (entry.GetExpressionType()) {
		case ExpressionType::COMPARE_IN:
		case ExpressionType::COMPARE_NOT_IN: {
			string op_type = entry.GetExpressionType() == ExpressionType::COMPARE_IN ? " IN " : " NOT IN ";
			string in_child = entry.children[0]->ToString();
			string child_list = "(";
			for (idx_t i = 1; i < entry.children.size(); i++) {
				if (i > 1) {
					child_list += ", ";
				}
				child_list += entry.children[i]->ToString();
			}
			child_list += ")";
			return "(" + in_child + op_type + child_list + ")";
		}
		case ExpressionType::OPERATOR_UNPACK: {
			return StringUtil::Format("UNPACK(%s)", entry.children[0]->ToString());
		}
		case ExpressionType::OPERATOR_TRY: {
			return StringUtil::Format("TRY(%s)", entry.children[0]->ToString());
		}
		case ExpressionType::OPERATOR_NOT: {
			string result = "(";
			result += ExpressionTypeToString(entry.GetExpressionType());
			result += " ";
			result += StringUtil::Join(entry.children, entry.children.size(), ", ",
			                           [](const unique_ptr<BASE> &child) { return child->ToString(); });
			result += ")";
			return result;
		}
		case ExpressionType::GROUPING_FUNCTION:
		case ExpressionType::OPERATOR_COALESCE: {
			string result = ExpressionTypeToString(entry.GetExpressionType());
			result += "(";
			result += StringUtil::Join(entry.children, entry.children.size(), ", ",
			                           [](const unique_ptr<BASE> &child) { return child->ToString(); });
			result += ")";
			return result;
		}
		case ExpressionType::OPERATOR_IS_NULL:
			return "(" + entry.children[0]->ToString() + " IS NULL)";
		case ExpressionType::OPERATOR_IS_NOT_NULL:
			return "(" + entry.children[0]->ToString() + " IS NOT NULL)";
		case ExpressionType::ARRAY_EXTRACT:
			return entry.children[0]->ToString() + "[" + entry.children[1]->ToString() + "]";
		case ExpressionType::ARRAY_SLICE: {
			string begin = entry.children[1]->ToString();
			if (begin == "[]") {
				begin = "";
			}
			string end = entry.children[2]->ToString();
			if (end == "[]") {
				if (entry.children.size() == 4) {
					end = "-";
				} else {
					end = "";
				}
			}
			if (entry.children.size() == 4) {
				return entry.children[0]->ToString() + "[" + begin + ":" + end + ":" + entry.children[3]->ToString() +
				       "]";
			}
			return entry.children[0]->ToString() + "[" + begin + ":" + end + "]";
		}
		case ExpressionType::STRUCT_EXTRACT: {
			if (entry.children[1]->GetExpressionType() != ExpressionType::VALUE_CONSTANT) {
				return string();
			}
			auto child_string = entry.children[1]->ToString();
			D_ASSERT(child_string.size() >= 3);
			D_ASSERT(child_string[0] == '\'' && child_string[child_string.size() - 1] == '\'');
			return StringUtil::Format("(%s).%s", entry.children[0]->ToString(),
			                          SQLIdentifier(child_string.substr(1, child_string.size() - 2)));
		}
		case ExpressionType::ARRAY_CONSTRUCTOR: {
			string result = "(ARRAY[";
			result += StringUtil::Join(entry.children, entry.children.size(), ", ",
			                           [](const unique_ptr<BASE> &child) { return child->ToString(); });
			result += "])";
			return result;
		}
		default:
			throw InternalException("Unrecognized operator type");
		}
	}